

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  ShaderType SVar1;
  TestType TVar2;
  Context *pCVar3;
  char *pcVar4;
  TestNode *pTVar5;
  LayoutBindingRenderCase *pLVar6;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *this_02;
  int extraout_EAX;
  int iVar7;
  TestNode *pTVar8;
  LayoutBindingNegativeCase *pLVar9;
  SamplerBindingRenderCase *pSVar10;
  ImageBindingRenderCase *pIVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  allocator<char> local_152;
  allocator<char> local_151;
  allocator<char> local_150;
  allocator<char> local_14f;
  allocator<char> local_14e;
  allocator<char> local_14d;
  allocator<char> local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  allocator<char> local_148;
  allocator<char> local_147;
  allocator<char> local_146;
  allocator<char> local_145;
  allocator<char> local_144;
  allocator<char> local_143;
  allocator<char> local_142;
  allocator<char> local_141;
  TestNode *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  LayoutBindingRenderCase *local_130;
  pointer local_128;
  LayoutBindingNegativeCase *local_120;
  allocator<char> local_118;
  allocator<char> local_117;
  allocator<char> local_116;
  allocator<char> local_115;
  allocator<char> local_114;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  allocator<char> local_110;
  allocator<char> local_10f;
  allocator<char> local_10e;
  allocator<char> local_10d;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  TestNode *local_e8;
  TestNode *local_e0;
  TestNode *local_d8;
  TestNode *local_d0;
  TestNode *local_c8;
  TestNode *local_c0;
  TestNode *local_b8;
  TestNode *local_b0;
  TestNode *local_a8;
  TestNode *local_a0;
  TestNode *local_98;
  TestNode *local_90;
  char *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  TestNode *local_60;
  TestNode *local_58;
  TestNode *local_50;
  TestNode *local_48;
  TestNode *local_40;
  long local_38;
  
  local_48 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_48,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler",
             "Test sampler layout binding");
  local_90 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_90,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler2d",
             "Test sampler2d layout binding");
  local_98 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_98,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler3d",
             "Test sampler3d layout binding");
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image",
             "Test image layout binding");
  local_a0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image2d",
             "Test image2d layout binding");
  local_a8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image3d",
             "Test image3d layout binding");
  local_b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding");
  local_b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding");
  local_50 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_50,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Test layout binding with invalid bindings");
  local_58 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_58,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler",
             "Test sampler layout binding with invalid bindings");
  local_c0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_c0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler2d",
             "Test sampler2d layout binding with invalid bindings");
  local_c8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_c8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler3d",
             "Test sampler3d layout binding with invalid bindings");
  local_60 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_60,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image",
             "Test image layout binding with invalid bindings");
  local_d0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_d0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image2d",
             "Test image2d layout binding with invalid bindings");
  local_d8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_d8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image3d",
             "Test image3d layout binding with invalid bindings");
  local_e0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_e0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding with invalid bindings");
  local_40 = pTVar8;
  local_e8 = (TestNode *)operator_new(0x70);
  local_140 = (TestNode *)this;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_e8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding with invalid bindings");
  if (init()::s_renderTestTypes == '\0') {
    iVar7 = __cxa_guard_acquire(&init()::s_renderTestTypes);
    if (iVar7 != 0) {
      init::s_renderTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[0].name,"vertex_binding_single",
                 (allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[0].descPostfix,"a single instance",
                 (allocator<char> *)&local_80);
      init::s_renderTestTypes[1].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[1].testType = TESTTYPE_BINDING_MAX;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[1].name,"vertex_binding_max",&local_152);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[1].descPostfix,"maximum binding point",
                 &local_141);
      init::s_renderTestTypes[2].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[2].testType = TESTTYPE_BINDING_MULTIPLE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[2].name,"vertex_binding_multiple",&local_142);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[2].descPostfix,"multiple instances",&local_143);
      init::s_renderTestTypes[3].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[3].testType = TESTTYPE_BINDING_ARRAY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[3].name,"vertex_binding_array",&local_144);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[3].descPostfix,"an array instance",&local_145);
      init::s_renderTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[4].testType = TESTTYPE_BINDING_MAX_ARRAY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[4].name,"vertex_binding_max_array",&local_146);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[4].descPostfix,
                 "an array instance with maximum binding point",&local_147);
      init::s_renderTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[5].name,"fragment_binding_single",&local_148);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[5].descPostfix,"a single instance",&local_149);
      init::s_renderTestTypes[6].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[6].testType = TESTTYPE_BINDING_MAX;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[6].name,"fragment_binding_max",&local_14a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[6].descPostfix,"maximum binding point",
                 &local_14b);
      init::s_renderTestTypes[7].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[7].testType = TESTTYPE_BINDING_MULTIPLE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[7].name,"fragment_binding_multiple",&local_14c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[7].descPostfix,"multiple instances",&local_14d);
      init::s_renderTestTypes[8].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[8].name,"fragment_binding_array",&local_14e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[8].descPostfix,"an array instance",&local_14f);
      init::s_renderTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[9].testType = TESTTYPE_BINDING_MAX_ARRAY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[9].name,"fragment_binding_max_array",&local_150)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[9].descPostfix,
                 "an array instance with maximum binding point",&local_151);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&init()::s_renderTestTypes);
    }
  }
  if (init()::s_negativeTestTypes == '\0') {
    iVar7 = __cxa_guard_acquire(&init()::s_negativeTestTypes);
    if (iVar7 != 0) {
      init::s_negativeTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0].name,"vertex_binding_over_max",
                 (allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0].descPostfix,"over maximum binding point",
                 (allocator<char> *)&local_80);
      init::s_negativeTestTypes[1].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[1].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[1].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[1].name,"fragment_binding_over_max",&local_152
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[1].descPostfix,"over maximum binding point",
                 &local_141);
      init::s_negativeTestTypes[2].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[2].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[2].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[2].name,"tess_control_binding_over_max",
                 &local_142);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[2].descPostfix,"over maximum binding point",
                 &local_143);
      init::s_negativeTestTypes[3].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[3].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[3].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[3].name,"tess_evaluation_binding_over_max",
                 &local_144);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[3].descPostfix,"over maximum binding point",
                 &local_145);
      init::s_negativeTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[4].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[4].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[4].name,"vertex_binding_neg",&local_146);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[4].descPostfix,"negative binding point",
                 &local_147);
      init::s_negativeTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[5].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[5].name,"fragment_binding_neg",&local_148);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[5].descPostfix,"negative binding point",
                 &local_149);
      init::s_negativeTestTypes[6].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[6].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[6].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[6].name,"tess_control_binding_neg",&local_14a)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[6].descPostfix,"negative binding point",
                 &local_14b);
      init::s_negativeTestTypes[7].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[7].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[7].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[7].name,"tess_evaluation_binding_neg",
                 &local_14c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[7].descPostfix,"negative binding point",
                 &local_14d);
      init::s_negativeTestTypes[8].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[8].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[8].name,"vertex_binding_over_max_array",
                 &local_14e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[8].descPostfix,"over maximum binding point",
                 &local_14f);
      init::s_negativeTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[9].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[9].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[9].name,"fragment_binding_over_max_array",
                 &local_150);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[9].descPostfix,"over maximum binding point",
                 &local_151);
      init::s_negativeTestTypes[10].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[10].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[10].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[10].name,"tess_control_binding_over_max_array"
                 ,&local_109);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[10].descPostfix,"over maximum binding point",
                 &local_10a);
      init::s_negativeTestTypes[0xb].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xb].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xb].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xb].name,
                 "tess_evaluation_binding_over_max_array",&local_10b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xb].descPostfix,"over maximum binding point",
                 &local_10c);
      init::s_negativeTestTypes[0xc].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0xc].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xc].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xc].name,"vertex_binding_neg_array",
                 &local_10d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xc].descPostfix,"negative binding point",
                 &local_10e);
      init::s_negativeTestTypes[0xd].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[0xd].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xd].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xd].name,"fragment_binding_neg_array",
                 &local_10f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xd].descPostfix,"negative binding point",
                 &local_110);
      init::s_negativeTestTypes[0xe].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[0xe].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xe].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xe].name,"tess_control_binding_neg_array",
                 &local_111);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xe].descPostfix,"negative binding point",
                 &local_112);
      init::s_negativeTestTypes[0xf].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xf].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xf].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xf].name,"tess_evaluation_binding_neg_array",
                 &local_113);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xf].descPostfix,"negative binding point",
                 &local_114);
      init::s_negativeTestTypes[0x10].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x10].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0x10].errorType = ERRORTYPE_CONTRADICTORY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x10].name,"binding_contradictory",&local_115)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x10].descPostfix,
                 "contradictory binding points",&local_116);
      init::s_negativeTestTypes[0x11].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x11].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0x11].errorType = ERRORTYPE_CONTRADICTORY;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x11].name,"binding_contradictory_array",
                 &local_117);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x11].descPostfix,
                 "contradictory binding points",&local_118);
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&init()::s_negativeTestTypes);
    }
  }
  pbVar12 = &init::s_renderTestTypes[0].descPostfix;
  pLVar9 = (LayoutBindingNegativeCase *)0xa;
  while( true ) {
    if (pLVar9 == (LayoutBindingNegativeCase *)0x0) break;
    local_120 = (LayoutBindingNegativeCase *)&pLVar9[-1].field_0x137;
    pSVar10 = (SamplerBindingRenderCase *)operator_new(0x120);
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Sampler2D layout binding with ",pbVar12);
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar10,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x8b5e,0xde1);
    tcu::TestNode::addChild(local_90,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_108);
    pSVar10 = (SamplerBindingRenderCase *)operator_new(0x120);
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Sampler3D layout binding with ",pbVar12);
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar10,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x8b5f,0x806f);
    tcu::TestNode::addChild(local_98,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_108);
    pIVar11 = (ImageBindingRenderCase *)operator_new(0x120);
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Image2D layout binding with ",pbVar12);
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar11,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x904d,0xde1);
    tcu::TestNode::addChild(local_a0,(TestNode *)pIVar11);
    std::__cxx11::string::~string((string *)&local_108);
    pIVar11 = (ImageBindingRenderCase *)operator_new(0x120);
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Image3D layout binding with ",pbVar12);
    local_138 = pbVar12;
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar11,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x904e,0x806f);
    tcu::TestNode::addChild(local_a8,(TestNode *)pIVar11);
    std::__cxx11::string::~string((string *)&local_108);
    local_130 = (LayoutBindingRenderCase *)operator_new(0x118);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    local_128 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_80,"UBO layout binding with ",local_138);
    local_88 = local_80._M_dataplus._M_p;
    SVar1 = *(ShaderType *)((long)&pbVar12[-2].field_2 + 8);
    TVar2 = *(TestType *)((long)&pbVar12[-2].field_2 + 0xc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ColorBlock",&local_152)
    ;
    pLVar6 = local_130;
    anon_unknown_1::LayoutBindingRenderCase::LayoutBindingRenderCase
              (local_130,pCVar3,local_128,local_88,SVar1,TVar2,0x8a2f,0x8a2b,0x8a2d,0x8a2e,
               &local_108);
    std::__cxx11::string::~string((string *)&local_108);
    (pLVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__UBOBindingRenderCase_00a0d1a0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    tcu::TestNode::addChild(local_b0,(TestNode *)pLVar6);
    std::__cxx11::string::~string((string *)&local_80);
    local_130 = (LayoutBindingRenderCase *)operator_new(0x118);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_80,"SSBO layout binding with ",local_138);
    local_128 = local_80._M_dataplus._M_p;
    SVar1 = *(ShaderType *)((long)&pbVar12[-2].field_2 + 8);
    TVar2 = *(TestType *)((long)&pbVar12[-2].field_2 + 0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"ColorBuffer",&local_152);
    pLVar6 = local_130;
    anon_unknown_1::LayoutBindingRenderCase::LayoutBindingRenderCase
              (local_130,pCVar3,pcVar4,local_128,SVar1,TVar2,0x90dd,0x90d6,0x90da,0x90dc,&local_108)
    ;
    std::__cxx11::string::~string((string *)&local_108);
    (pLVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SSBOBindingRenderCase_00a0d1f8;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pLVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    tcu::TestNode::addChild(local_b8,(TestNode *)pLVar6);
    std::__cxx11::string::~string((string *)&local_80);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &local_138[2]._M_string_length;
    pLVar9 = local_120;
  }
  pbVar12 = &init::s_negativeTestTypes[0].descPostfix;
  lVar13 = 0x12;
  while( true ) {
    pTVar8 = local_48;
    if (lVar13 == 0) break;
    pTVar8 = (TestNode *)operator_new(0x138);
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid sampler2d layout binding using ",pbVar12);
    local_138 = pbVar12;
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar8,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x8b5e);
    tcu::TestNode::addChild(local_c0,pTVar8);
    std::__cxx11::string::~string((string *)&local_108);
    pTVar8 = (TestNode *)operator_new(0x138);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid sampler3d layout binding using ",local_138);
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar8,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x8b5f);
    tcu::TestNode::addChild(local_c8,pTVar8);
    std::__cxx11::string::~string((string *)&local_108);
    pTVar8 = (TestNode *)operator_new(0x138);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid image2d layout binding using ",local_138);
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar8,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x904d);
    tcu::TestNode::addChild(local_d0,pTVar8);
    std::__cxx11::string::~string((string *)&local_108);
    pTVar8 = (TestNode *)operator_new(0x138);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid image3d layout binding using ",local_138);
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar8,pCVar3,pcVar4,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x904e);
    tcu::TestNode::addChild(local_d8,pTVar8);
    local_38 = lVar13 + -1;
    std::__cxx11::string::~string((string *)&local_108);
    local_120 = (LayoutBindingNegativeCase *)operator_new(0x138);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    local_130 = (LayoutBindingRenderCase *)local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_80,"Invalid UBO layout binding using ",local_138);
    local_88 = local_80._M_dataplus._M_p;
    SVar1 = *(ShaderType *)&pbVar12[-2].field_2;
    TVar2 = *(TestType *)((long)&pbVar12[-2].field_2 + 4);
    local_128 = (pointer)(ulong)*(uint *)((long)&pbVar12[-2].field_2 + 8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ColorBlock",&local_152)
    ;
    pLVar9 = local_120;
    anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
              (local_120,pCVar3,(char *)local_130,local_88,SVar1,TVar2,(ErrorType)local_128,0x8a2f,
               0x8a2b,0x8e89,0x8e8a,0x8a2d,0x8a2e,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    (pLVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__UBOBindingNegativeCase_00a0d358;
    tcu::TestNode::addChild(local_e0,(TestNode *)pLVar9);
    std::__cxx11::string::~string((string *)&local_80);
    local_120 = (LayoutBindingNegativeCase *)operator_new(0x138);
    pbVar12 = local_138;
    pCVar3 = (Context *)local_140[1]._vptr_TestNode;
    pcVar4 = local_138[-1]._M_dataplus._M_p;
    std::operator+(&local_80,"Invalid SSBO layout binding using ",local_138);
    local_128 = local_80._M_dataplus._M_p;
    SVar1 = *(ShaderType *)&pbVar12[-2].field_2;
    TVar2 = *(TestType *)((long)&pbVar12[-2].field_2 + 4);
    local_130 = (LayoutBindingRenderCase *)(ulong)*(uint *)((long)&pbVar12[-2].field_2 + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"ColorBuffer",&local_152);
    pLVar9 = local_120;
    anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
              (local_120,pCVar3,pcVar4,local_128,SVar1,TVar2,(ErrorType)local_130,0x90dd,0x90d6,
               0x90d8,0x90d9,0x90da,0x90dc,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    (pLVar9->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SSBOBindingNegativeCase_00a0d3b0;
    tcu::TestNode::addChild(local_e8,(TestNode *)pLVar9);
    std::__cxx11::string::~string((string *)&local_80);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &local_138[2].field_2;
    lVar13 = local_38;
  }
  tcu::TestNode::addChild(local_48,local_90);
  tcu::TestNode::addChild(pTVar8,local_98);
  this_02 = local_40;
  tcu::TestNode::addChild(local_40,local_a0);
  tcu::TestNode::addChild(this_02,local_a8);
  this_00 = local_58;
  tcu::TestNode::addChild(local_58,local_c0);
  tcu::TestNode::addChild(this_00,local_c8);
  pTVar5 = local_60;
  tcu::TestNode::addChild(local_60,local_d0);
  tcu::TestNode::addChild(pTVar5,local_d8);
  this_01 = local_50;
  tcu::TestNode::addChild(local_50,this_00);
  tcu::TestNode::addChild(this_01,local_e0);
  tcu::TestNode::addChild(this_01,local_e8);
  tcu::TestNode::addChild(this_01,pTVar5);
  pTVar5 = local_140;
  tcu::TestNode::addChild(local_140,pTVar8);
  tcu::TestNode::addChild(pTVar5,local_b0);
  tcu::TestNode::addChild(pTVar5,local_b8);
  tcu::TestNode::addChild(pTVar5,this_02);
  tcu::TestNode::addChild(pTVar5,this_01);
  return extraout_EAX;
}

Assistant:

void LayoutBindingTests::init (void)
{
	// Render test groups
	tcu::TestCaseGroup* const samplerBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding");
	tcu::TestCaseGroup* const sampler2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding");
	tcu::TestCaseGroup* const sampler3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding");

	tcu::TestCaseGroup* const imageBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding");
	tcu::TestCaseGroup* const image2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding");
	tcu::TestCaseGroup* const image3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding");

	tcu::TestCaseGroup* const UBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding");
	tcu::TestCaseGroup* const SSBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding");

	// Negative test groups
	tcu::TestCaseGroup* const negativeBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "negative",		"Test layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeSamplerBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeImageBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeUBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSSBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding with invalid bindings");

	static const struct RenderTestType
	{
		ShaderType				shaderType;
		TestType				testType;
		std::string				name;
		std::string				descPostfix;
	} s_renderTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_SINGLE,		"vertex_binding_single",		"a single instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX,			"vertex_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MULTIPLE,		"vertex_binding_multiple",		"multiple instances"},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_ARRAY,			"vertex_binding_array",			"an array instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX_ARRAY,		"vertex_binding_max_array",		"an array instance with maximum binding point" },

		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_SINGLE,		"fragment_binding_single",		"a single instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX,			"fragment_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MULTIPLE,		"fragment_binding_multiple",	"multiple instances"},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_ARRAY,			"fragment_binding_array",		"an array instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX_ARRAY,		"fragment_binding_max_array",	"an array instance with maximum binding point" },
	};

	static const struct NegativeTestType
	{
		ShaderType								shaderType;
		TestType								testType;
		LayoutBindingNegativeCase::ErrorType	errorType;
		std::string								name;
		std::string								descPostfix;
	} s_negativeTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max",					"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max",				"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg",					"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg",				"negative binding point"	   },

		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max_array",		"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max_array",	"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg_array",					"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg_array",				"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg_array",			"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg_array",		"negative binding point"	   },

		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory",					"contradictory binding points" },
		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory_array",				"contradictory binding points" },
	};

	// Render tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_renderTestTypes); ++testNdx)
	{
		const RenderTestType& test = s_renderTestTypes[testNdx];

		// Render sampler binding tests
		sampler2dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_2D, GL_TEXTURE_2D));
		sampler3dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_3D, GL_TEXTURE_3D));

		// Render image binding tests
		image2dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_2D, GL_TEXTURE_2D));
		image3dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_3D, GL_TEXTURE_3D));

		// Render UBO binding tests
		UBOBindingTestGroup->addChild(new UBOBindingRenderCase(m_context, test.name.c_str(), ("UBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));

		// Render SSBO binding tests
		SSBOBindingTestGroup->addChild(new SSBOBindingRenderCase(m_context, test.name.c_str(), ("SSBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));
	}

	// Negative binding tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_negativeTestTypes); ++testNdx)
	{
		const NegativeTestType& test = s_negativeTestTypes[testNdx];

		// Negative sampler binding tests
		negativeSampler2dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_2D));
		negativeSampler3dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_3D));

		// Negative image binding tests
		negativeImage2dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_2D));
		negativeImage3dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_3D));

		// Negative UBO binding tests
		negativeUBOBindingTestGroup->addChild(new UBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid UBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));

		// Negative SSBO binding tests
		negativeSSBOBindingTestGroup->addChild(new SSBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid SSBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));
	}

	samplerBindingTestGroup->addChild(sampler2dBindingTestGroup);
	samplerBindingTestGroup->addChild(sampler3dBindingTestGroup);

	imageBindingTestGroup->addChild(image2dBindingTestGroup);
	imageBindingTestGroup->addChild(image3dBindingTestGroup);

	negativeSamplerBindingTestGroup->addChild(negativeSampler2dBindingTestGroup);
	negativeSamplerBindingTestGroup->addChild(negativeSampler3dBindingTestGroup);

	negativeImageBindingTestGroup->addChild(negativeImage2dBindingTestGroup);
	negativeImageBindingTestGroup->addChild(negativeImage3dBindingTestGroup);

	negativeBindingTestGroup->addChild(negativeSamplerBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeUBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeSSBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeImageBindingTestGroup);

	addChild(samplerBindingTestGroup);
	addChild(UBOBindingTestGroup);
	addChild(SSBOBindingTestGroup);
	addChild(imageBindingTestGroup);
	addChild(negativeBindingTestGroup);
}